

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

int __thiscall OpenMD::Polynomial<double>::degree(Polynomial<double> *this)

{
  bool bVar1;
  iterator this_00;
  pointer ppVar2;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *in_RDI;
  iterator i;
  int deg;
  _Self local_18;
  int local_c;
  
  local_c = 0;
  local_18._M_node =
       (_Base_ptr)
       std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::begin
                 (in_RDI);
  while( true ) {
    this_00 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
              ::end(in_RDI);
    bVar1 = std::operator!=(&local_18,(_Self *)&stack0xffffffffffffffe0);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_double>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_double>_> *)0x3cf141);
    if (local_c < ppVar2->first) {
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_double>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_int,_double>_> *)0x3cf153);
      local_c = ppVar2->first;
    }
    std::_Rb_tree_iterator<std::pair<const_int,_double>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_double>_> *)this_00._M_node);
  }
  return local_c;
}

Assistant:

int degree() {
      int deg = 0;
      for (iterator i = polyPairMap_.begin(); i != polyPairMap_.end(); ++i) {
        if (i->first > deg) deg = i->first;
      }
      return deg;
    }